

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

str_t * get_sys_temp_dir(str_t *sys_temp_dir)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  int len;
  char *s;
  str_t *sys_temp_dir_local;
  
  if (sys_temp_dir == (str_t *)0x0) {
    sys_temp_dir_local = (str_t *)0x0;
  }
  else {
    pcVar2 = getenv("TMPDIR");
    sys_temp_dir_local = sys_temp_dir;
    if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
      pcVar2 = strdup("/tmp");
      sys_temp_dir->name = pcVar2;
      sys_temp_dir->size = 5;
    }
    else {
      sVar3 = strlen(pcVar2);
      iVar1 = (int)sVar3;
      if (pcVar2[iVar1 + -1] == '/') {
        pcVar2 = strndup(pcVar2,(long)(iVar1 + -1));
        sys_temp_dir->name = pcVar2;
        sys_temp_dir->size = (long)iVar1;
      }
      else {
        pcVar2 = strndup(pcVar2,(long)iVar1);
        sys_temp_dir->name = pcVar2;
        sys_temp_dir->size = (long)(iVar1 + 1);
      }
      fprintf(_stderr,"%s: name: (%s)\n","get_sys_temp_dir",sys_temp_dir->name);
      fprintf(_stderr,"%s: size: (%lu)\n","get_sys_temp_dir",sys_temp_dir->size);
    }
  }
  return sys_temp_dir_local;
}

Assistant:

str_t *
get_sys_temp_dir (str_t *sys_temp_dir)
{
  if (unlikely (sys_temp_dir == NULL))
    return NULL;

#ifdef WINDOWS
    {
      wchar_t w_tmp[MAX_PATH];
      char *tmp;
      size_t len = GetTempPathW (MAX_PATH, w_tmp);
      assert (0 < len);

      sys_temp_dir->name = wide_char_to_multibyte (w_tmp, len, &sys_temp_dir->size);

      return sys_temp_dir;
    }
#else
    {
      char* s = getenv ("TMPDIR");
      if (s && *s)
        {
          int len = strlen (s);

          if (s[len - 1] == DIR_SEPARATOR)
            {
              sys_temp_dir->name = strndup (s, len - 1);
              sys_temp_dir->size = len; /* len - 1 (last char) + 1 (terminating 0 byte)*/
            }
          else
            {
              sys_temp_dir->name = strndup (s, len);
              sys_temp_dir->size = len + 1 /* + 1 (terminating 0 byte)*/;
            }
          elog_debug ("%s: name: (%s)\n", __func__, sys_temp_dir->name);
          elog_debug ("%s: size: (%lu)\n", __func__, sys_temp_dir->size);

          return sys_temp_dir;
      }
    }

  /* Fallback */
  sys_temp_dir->name = strdup ("/tmp");
  sys_temp_dir->size = sizeof ("/tmp");

  return sys_temp_dir;
#endif
}